

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

bool __thiscall wabt::WastLexer::ReadHexNum(WastLexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  
  do {
    do {
      pbVar1 = (byte *)this->buffer_end_;
      pbVar2 = (byte *)this->cursor_;
      if (pbVar2 < pbVar1) {
        lVar3 = (ulong)*pbVar2 + 1;
      }
      else {
        lVar3 = 0;
      }
      if ((""[lVar3] & 4U) == 0) {
        return false;
      }
      if (pbVar2 < pbVar1) {
        this->cursor_ = (char *)(pbVar2 + 1);
      }
      pbVar2 = (byte *)this->cursor_;
      if (pbVar2 < pbVar1) {
        bVar4 = *pbVar2 == 0x5f;
      }
      else {
        bVar4 = false;
      }
      if (bVar4 && pbVar2 < pbVar1) {
        this->cursor_ = (char *)(pbVar2 + 1);
      }
    } while (bVar4);
    if (this->cursor_ < pbVar1) {
      lVar3 = (ulong)(byte)*this->cursor_ + 1;
    }
    else {
      lVar3 = 0;
    }
  } while ((""[lVar3] & 4U) != 0);
  return true;
}

Assistant:

bool WastLexer::ReadHexNum() {
  if (IsHexDigit(PeekChar())) {
    ReadChar();
    return MatchChar('_') || IsHexDigit(PeekChar()) ? ReadHexNum() : true;
  }
  return false;
}